

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f105d::OwnershipAnalysis::OwnershipAnalysis
          (OwnershipAnalysis *this,command_set *commands,BuildFileDelegate *fileDelegate)

{
  bool bVar1;
  StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
  *this_00;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  *this_01;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *pvVar2;
  reference ppBVar3;
  iterator iVar4;
  iterator iVar5;
  pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> local_98;
  BuildNode *local_88;
  BuildNode *input;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range3_1;
  BuildNode *local_58;
  BuildNode *output;
  const_iterator __end3;
  const_iterator __begin3;
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *__range3;
  Command *command;
  StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  local_28;
  const_iterator it;
  BuildFileDelegate *fileDelegate_local;
  command_set *commands_local;
  OwnershipAnalysis *this_local;
  
  it.
  super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
          )(StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
            )fileDelegate;
  std::
  map<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*,_std::less<llbuild::buildsystem::BuildNode_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>_>
  ::map(&this->includedPaths);
  std::
  map<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*,_std::less<llbuild::buildsystem::BuildNode_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*const,_llbuild::buildsystem::Command_*>_>_>
  ::map(&this->excludedPaths);
  this->fileDelegate =
       (BuildFileDelegate *)
       it.
       super_StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
       .Ptr;
  std::
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ::vector(&this->outputNodesAndCommands);
  std::
  vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
  ::vector(&this->directoryInputNodesAndCommands);
  local_28.Ptr = (StringMapEntryBase **)
                 llvm::
                 StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
                 ::begin(commands);
  while( true ) {
    command = (Command *)
              llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
              ::end(commands);
    bVar1 = llvm::
            iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_&>
            ::operator!=((iterator_facade_base<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_std::forward_iterator_tag,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_long,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_*,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_&>
                          *)&local_28,
                         (StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
                          *)&command);
    if (!bVar1) break;
    this_00 = llvm::
              StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
              ::operator*((StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
                           *)&local_28);
    this_01 = llvm::
              StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>
              ::getValue(this_00);
    __range3 = (vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                *)std::
                  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
                  ::get(this_01);
    pvVar2 = llbuild::buildsystem::Command::getOutputs((Command *)__range3);
    __end3 = std::
             vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
             ::begin(pvVar2);
    output = (BuildNode *)
             std::
             vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
             ::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                                       *)&output), bVar1) {
      ppBVar3 = __gnu_cxx::
                __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                ::operator*(&__end3);
      local_58 = *ppBVar3;
      bVar1 = llbuild::buildsystem::BuildNode::isVirtual(local_58);
      if (!bVar1) {
        std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>::
        pair<llbuild::buildsystem::BuildNode_*&,_llbuild::buildsystem::Command_*&,_true>
                  ((pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*> *)
                   &__range3_1,&local_58,(Command **)&__range3);
        std::
        vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
        ::push_back(&this->outputNodesAndCommands,(value_type *)&__range3_1);
      }
      __gnu_cxx::
      __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
      ::operator++(&__end3);
    }
    pvVar2 = llbuild::buildsystem::Command::getInputs((Command *)__range3);
    __end3_1 = std::
               vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
               ::begin(pvVar2);
    input = (BuildNode *)
            std::
            vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ::end(pvVar2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                               *)&input), bVar1) {
      ppBVar3 = __gnu_cxx::
                __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
                ::operator*(&__end3_1);
      local_88 = *ppBVar3;
      bVar1 = llbuild::buildsystem::BuildNode::isDirectory(local_88);
      if (bVar1) {
        std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>::
        pair<llbuild::buildsystem::BuildNode_*&,_llbuild::buildsystem::Command_*&,_true>
                  (&local_98,&local_88,(Command **)&__range3);
        std::
        vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
        ::push_back(&this->directoryInputNodesAndCommands,&local_98);
      }
      __gnu_cxx::
      __normal_iterator<llbuild::buildsystem::BuildNode_*const_*,_std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>_>
      ::operator++(&__end3_1);
    }
    llvm::
    StringMapIterBase<llvm::StringMapConstIterator<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>,_const_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>_>_>
    ::operator++(&local_28,0);
  }
  iVar4 = std::
          vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
          ::begin(&this->outputNodesAndCommands);
  iVar5 = std::
          vector<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>,_std::allocator<std::pair<llbuild::buildsystem::BuildNode_*,_llbuild::buildsystem::Command_*>_>_>
          ::end(&this->outputNodesAndCommands);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>*,std::vector<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::allocator<std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>>>>,(anonymous_namespace)::OwnershipAnalysis::OwnershipAnalysis(llvm::StringMap<std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>,llvm::MallocAllocator>const&,llbuild::buildsystem::BuildFileDelegate&)::_lambda(std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>,std::pair<llbuild::buildsystem::BuildNode*,llbuild::buildsystem::Command*>)_1_>
            (iVar4._M_current,iVar5._M_current);
  return;
}

Assistant:

OwnershipAnalysis(const BuildDescription::command_set& commands, BuildFileDelegate& fileDelegate): fileDelegate(fileDelegate) {
    // Extract outputs and directory inputs of all commands
    for (auto it = commands.begin(); it != commands.end(); it++) {
      Command* command = (*it).getValue().get();
      for (auto output: command->getOutputs()) {
        if (!output->isVirtual()) {
          outputNodesAndCommands.push_back(std::pair<BuildNode*, Command*>(output, command));
        }
      }

      for (auto input: command->getInputs()) {
        if (input->isDirectory()) {
          directoryInputNodesAndCommands.push_back(std::pair<BuildNode*, Command*>(input, command));
        }
      }
    }

    // Sort paths according to length to ensure we assign owner to parent before assigning owner to its subpaths
    std::sort(outputNodesAndCommands.begin(),
              outputNodesAndCommands.end(),
              [](const std::pair<BuildNode*, Command*> pairA,
                 const std::pair<BuildNode*, Command*> pairB) -> bool {
      return pairA.first->getName().str().length() < pairB.first->getName().str().length();
    });
  }